

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Minefield_Query_PDU::Decode
          (Minefield_Query_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 *pKVar1;
  pointer pPVar2;
  pointer pPVar3;
  pointer puVar4;
  iterator __position;
  KUINT8 *pKVar5;
  KUINT16 KVar6;
  KException *this_00;
  int iVar7;
  undefined7 in_register_00000011;
  ushort uVar8;
  byte bVar9;
  pointer pPVar10;
  bool bVar11;
  KUINT16 ui16Tmp;
  KString local_58;
  KUINT8 *local_38;
  
  KVar6 = KDataStream::GetBufferSize(stream);
  iVar7 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar7 = 0;
  }
  if (iVar7 + (uint)KVar6 < 0x28) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Decode","");
    KException::KException(this_00,&local_58,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pPVar2 = (this->m_vPoints).
           super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar3 = (this->m_vPoints).
           super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pPVar10 = pPVar2;
  if (pPVar3 != pPVar2) {
    do {
      (**(pPVar10->super_DataTypeBase)._vptr_DataTypeBase)(pPVar10);
      pPVar10 = pPVar10 + 1;
    } while (pPVar10 != pPVar3);
    (this->m_vPoints).
    super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar2;
  }
  puVar4 = (this->m_vui16SensorTypes).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar4) {
    (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar4;
  }
  Minefield_Header::Decode(&this->super_Minefield_Header,stream,ignoreHeader);
  (*(this->m_ReqID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_ReqID,stream);
  KDataStream::Read(stream,&this->m_ui8ReqID);
  KDataStream::Read(stream,&this->m_ui8NumPerimPoints);
  KDataStream::Read(stream,&this->m_ui8Padding1);
  local_38 = &this->m_ui8NumSensTyp;
  KDataStream::Read(stream,local_38);
  (*(this->m_DataFilter).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_DataFilter,stream);
  (*(this->m_MineTypFilter).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_MineTypFilter,stream)
  ;
  if (this->m_ui8NumPerimPoints != '\0') {
    bVar9 = 0;
    do {
      DATA_TYPE::PerimeterPointCoordinate::PerimeterPointCoordinate
                ((PerimeterPointCoordinate *)&local_58,stream);
      std::
      vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
      ::emplace_back<KDIS::DATA_TYPE::PerimeterPointCoordinate>
                (&this->m_vPoints,(PerimeterPointCoordinate *)&local_58);
      DATA_TYPE::PerimeterPointCoordinate::~PerimeterPointCoordinate
                ((PerimeterPointCoordinate *)&local_58);
      bVar9 = bVar9 + 1;
    } while (bVar9 < this->m_ui8NumPerimPoints);
  }
  pKVar5 = local_38;
  local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffffffff0000;
  if (*local_38 == 0) {
    bVar11 = true;
  }
  else {
    uVar8 = 0;
    do {
      KDataStream::Read<unsigned_short>(stream,(unsigned_short *)&local_58);
      __position._M_current =
           (this->m_vui16SensorTypes).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vui16SensorTypes).
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)
                   &this->m_vui16SensorTypes,__position,(unsigned_short *)&local_58);
      }
      else {
        *__position._M_current = (unsigned_short)local_58._M_dataplus._M_p;
        (this->m_vui16SensorTypes).
        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < *pKVar5);
    bVar11 = (*pKVar5 & 1) == 0;
  }
  if (this->m_bNeedsPadding == true) {
    pKVar1 = &(this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 - 2;
  }
  if (bVar11) {
    this->m_bNeedsPadding = false;
  }
  else {
    pKVar1 = &(this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + 2;
    this->m_bNeedsPadding = true;
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding1);
  }
  return;
}

Assistant:

void Minefield_Query_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < MINEFIELD_QUERY_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vPoints.clear();
    m_vui16SensorTypes.clear();

    Minefield_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_ReqID
           >> m_ui8ReqID
           >> m_ui8NumPerimPoints
           >> m_ui8Padding1
           >> m_ui8NumSensTyp
           >> KDIS_STREAM m_DataFilter
           >> KDIS_STREAM m_MineTypFilter;

    for( KUINT8 i = 0; i < m_ui8NumPerimPoints; ++i )
    {
        m_vPoints.push_back( PerimeterPointCoordinate( stream ) );
    }

    KUINT16 ui16Tmp = 0;
    for( KUINT16 j = 0; j < m_ui8NumSensTyp; ++j )
    {
        stream >> ui16Tmp;
        m_vui16SensorTypes.push_back( ui16Tmp );
    }

    // Does the PDU contain padding?
    calcPadding();
    if( m_bNeedsPadding )
    {
        stream >> m_ui16Padding1;
    }
}